

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansv.hpp
# Opt level: O2

void update_nsv_queue<unsigned_long,1>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *nsv,
               deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *q,unsigned_long *next_value,size_t idx,size_t prefix)

{
  ulong uVar1;
  pair<unsigned_long,_unsigned_long> *ppVar2;
  _Elt_pointer ppVar3;
  
  do {
    ppVar3 = (q->
             super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             )._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVar3 == (q->
                  super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  )._M_impl.super__Deque_impl_data._M_start._M_cur) {
      return;
    }
    uVar1 = *next_value;
    if (ppVar3 == (q->
                  super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  )._M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppVar2 = (q->
               super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               )._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
      if (ppVar2[0x1f].first <= uVar1) {
        ppVar2 = (q->
                 super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 )._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        if (uVar1 != ppVar2[0x1f].first) {
          return;
        }
        ppVar3 = ppVar2 + 0x20;
        goto LAB_00134b2f;
      }
      ppVar3 = ppVar2 + 0x20;
    }
    else if (ppVar3[-1].first <= uVar1) {
      if (uVar1 != ppVar3[-1].first) {
        return;
      }
LAB_00134b2f:
      (nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start[ppVar3[-1].second - prefix] = idx;
      std::
      deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::pop_back(q);
      return;
    }
    (nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_start[ppVar3[-1].second - prefix] = idx;
    std::
    deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::pop_back(q);
  } while( true );
}

Assistant:

inline void update_nsv_queue(std::vector<size_t>& nsv, std::deque<std::pair<T,size_t>>& q, const T& next_value, size_t idx, size_t prefix) {
    while (!q.empty() && next_value < q.back().first) {
        // current element is the min for in[i-1]
        nsv[q.back().second-prefix] = idx;
        if (type == furthest_eq) {
            // if that element is followed in the queue by equal elements,
            // set them to the furthest
            std::pair<T,size_t> furthest = q.back();
            q.pop_back();
            while (!q.empty() && furthest.first == q.back().first) {
                nsv[q.back().second-prefix] = furthest.second;
                q.pop_back();
            }
        } else {
            q.pop_back();
        }
    }
    if (type == nearest_eq) {
        if (!q.empty() && next_value == q.back().first) {
            // replace the equal element
            nsv[q.back().second-prefix] = idx;
            q.pop_back();
        }
    }
}